

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenMemoryFill(BinaryenModuleRef module,BinaryenExpressionRef dest,BinaryenExpressionRef value,
                  BinaryenExpressionRef size,char *memoryName)

{
  char *size_00;
  BinaryenExpressionRef value_00;
  BinaryenExpressionRef dest_00;
  MemoryFill *pMVar1;
  Name memory;
  Builder local_38;
  char *local_30;
  char *memoryName_local;
  BinaryenExpressionRef size_local;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef dest_local;
  BinaryenModuleRef module_local;
  
  local_30 = memoryName;
  memoryName_local = (char *)size;
  size_local = value;
  value_local = dest;
  dest_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_38,module);
  dest_00 = value_local;
  value_00 = size_local;
  size_00 = memoryName_local;
  memory = getMemoryName((BinaryenModuleRef)dest_local,local_30);
  pMVar1 = wasm::Builder::makeMemoryFill(&local_38,dest_00,value_00,(Expression *)size_00,memory);
  return (BinaryenExpressionRef)pMVar1;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryFill(BinaryenModuleRef module,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef value,
                                         BinaryenExpressionRef size,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryFill((Expression*)dest,
                      (Expression*)value,
                      (Expression*)size,
                      getMemoryName(module, memoryName)));
}